

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateHoveredWindowAndCaptureFlags(void)

{
  ImVec2 *pIVar1;
  ImGuiWindow **ppIVar2;
  double *pdVar3;
  double dVar4;
  short sVar5;
  uint uVar6;
  ImGuiWindow *pIVar7;
  ImGuiContext *pIVar8;
  ImGuiWindow *pIVar9;
  ImGuiViewportP *pIVar10;
  byte bVar11;
  ImGuiWindow *pIVar12;
  ImGuiContext *g;
  byte bVar13;
  byte bVar14;
  ImVec2 IVar15;
  ImGuiWindow *pIVar16;
  long lVar17;
  float fVar18;
  int iVar19;
  float fVar20;
  int iVar21;
  bool bVar22;
  float fVar23;
  undefined1 auVar24 [16];
  float fVar25;
  
  pIVar8 = GImGui;
  pIVar9 = GImGui->MovingWindow;
  if (pIVar9 == (ImGuiWindow *)0x0) {
    pIVar10 = (ImGuiViewportP *)0x0;
    pIVar12 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar10 = pIVar9->Viewport;
    pIVar9->Viewport = GImGui->MouseViewport;
    pIVar12 = (ImGuiWindow *)0x0;
    if ((pIVar9->Flags & 0x200) == 0) {
      pIVar12 = pIVar9;
    }
  }
  pIVar1 = &(pIVar8->Style).TouchExtraPadding;
  IVar15 = *pIVar1;
  if ((pIVar8->IO).ConfigWindowsResizeFromEdges == true) {
    auVar24._8_8_ = 0;
    auVar24._0_4_ = (pIVar8->Style).TouchExtraPadding.x;
    auVar24._4_4_ = (pIVar8->Style).TouchExtraPadding.y;
    auVar24 = maxps(auVar24,_DAT_0021e360);
    IVar15 = auVar24._0_8_;
  }
  lVar17 = (long)(pIVar8->Windows).Size;
  if (lVar17 < 1) {
    pIVar16 = (ImGuiWindow *)0x0;
  }
  else {
    lVar17 = lVar17 + 1;
    pIVar16 = (ImGuiWindow *)0x0;
    do {
      pIVar7 = (pIVar8->Windows).Data[lVar17 + -2];
      bVar22 = false;
      if ((((pIVar7->Active == true) && (pIVar7->Hidden == false)) &&
          (uVar6 = pIVar7->Flags, (uVar6 >> 9 & 1) == 0)) &&
         (pIVar7->Viewport == pIVar8->MouseViewport)) {
        fVar20 = pIVar1->x;
        if ((uVar6 & 0x1000042) == 0) {
          fVar20 = IVar15.x;
        }
        fVar23 = (pIVar8->IO).MousePos.x;
        if ((pIVar7->OuterRectClipped).Min.x - fVar20 <= fVar23) {
          fVar18 = (pIVar8->Style).TouchExtraPadding.y;
          if ((uVar6 & 0x1000042) == 0) {
            fVar18 = IVar15.y;
          }
          fVar25 = (pIVar8->IO).MousePos.y;
          if ((((pIVar7->OuterRectClipped).Min.y - fVar18 <= fVar25) &&
              (fVar23 < fVar20 + (pIVar7->OuterRectClipped).Max.x)) &&
             (fVar25 < fVar18 + (pIVar7->OuterRectClipped).Max.y)) {
            sVar5 = (pIVar7->HitTestHoleSize).x;
            if (sVar5 != 0) {
              iVar19 = (int)(pIVar7->HitTestHoleOffset).x;
              fVar23 = fVar23 - (pIVar7->Pos).x;
              if ((float)iVar19 <= fVar23) {
                fVar25 = fVar25 - (pIVar7->Pos).y;
                iVar21 = (int)(pIVar7->HitTestHoleOffset).y;
                bVar22 = fVar25 < (float)((pIVar7->HitTestHoleSize).y + iVar21) &&
                         ((float)iVar21 <= fVar25 && fVar23 < (float)(iVar19 + sVar5));
              }
              else {
                bVar22 = false;
              }
              if (bVar22) {
                bVar22 = false;
                goto LAB_001535d1;
              }
            }
            if (pIVar12 == (ImGuiWindow *)0x0) {
              pIVar12 = pIVar7;
            }
            if (((pIVar16 == (ImGuiWindow *)0x0) && (pIVar16 = pIVar7, pIVar9 != (ImGuiWindow *)0x0)
                ) && (pIVar7->RootWindow == pIVar9->RootWindow)) {
              pIVar16 = (ImGuiWindow *)0x0;
            }
            bVar22 = pIVar16 != (ImGuiWindow *)0x0 && pIVar12 != (ImGuiWindow *)0x0;
          }
        }
      }
LAB_001535d1:
    } while ((!bVar22) && (lVar17 = lVar17 + -1, 1 < lVar17));
  }
  pIVar8->HoveredWindow = pIVar12;
  if (pIVar12 == (ImGuiWindow *)0x0) {
    pIVar12 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar12 = pIVar12->RootWindow;
  }
  pIVar8->HoveredRootWindow = pIVar12;
  pIVar8->HoveredWindowUnderMovingWindow = pIVar16;
  if (pIVar9 != (ImGuiWindow *)0x0) {
    pIVar9->Viewport = pIVar10;
  }
  ppIVar2 = &pIVar8->HoveredWindow;
  pIVar9 = GetTopMostPopupModal();
  if (((pIVar9 != (ImGuiWindow *)0x0) && (pIVar12 != (ImGuiWindow *)0x0)) &&
     (pIVar12->RootWindow != pIVar9)) {
    do {
      if (pIVar12 == pIVar9) goto LAB_00153657;
      pIVar12 = pIVar12->ParentWindow;
    } while (pIVar12 != (ImGuiWindow *)0x0);
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
LAB_00153657:
  uVar6 = (pIVar8->IO).ConfigFlags;
  if ((uVar6 & 0x10) != 0) {
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  iVar19 = -1;
  lVar17 = 0;
  bVar11 = 0;
  do {
    if ((pIVar8->IO).MouseClicked[lVar17] == true) {
      bVar22 = true;
      if (*ppIVar2 == (ImGuiWindow *)0x0) {
        bVar22 = (pIVar8->OpenPopupStack).Size != 0;
      }
      (pIVar8->IO).MouseDownOwned[lVar17] = bVar22;
    }
    bVar22 = (pIVar8->IO).MouseDown[lVar17];
    if ((bVar22 == true) &&
       ((iVar19 == -1 ||
        (dVar4 = (pIVar8->IO).MouseClickedTime[iVar19],
        pdVar3 = (pIVar8->IO).MouseClickedTime + lVar17, *pdVar3 <= dVar4 && dVar4 != *pdVar3)))) {
      iVar19 = (int)lVar17;
    }
    bVar11 = bVar11 & 1 | bVar22;
    lVar17 = lVar17 + 1;
  } while (lVar17 != 5);
  if (iVar19 == -1) {
    bVar13 = 1;
  }
  else {
    bVar13 = (pIVar8->IO).MouseDownOwned[iVar19];
  }
  if (pIVar8->DragDropActive == true) {
    bVar14 = ((byte)pIVar8->DragDropSourceFlags & 0x10) >> 4;
  }
  else {
    bVar14 = 0;
  }
  if (bVar14 == 0 && (bVar13 & 1) == 0) {
    *ppIVar2 = (ImGuiWindow *)0x0;
    pIVar8->HoveredRootWindow = (ImGuiWindow *)0x0;
    pIVar8->HoveredWindowUnderMovingWindow = (ImGuiWindow *)0x0;
  }
  if (pIVar8->WantCaptureMouseNextFrame == -1) {
    if ((bVar13 == 0) || ((bVar22 = true, *ppIVar2 == (ImGuiWindow *)0x0 && (bVar11 == 0)))) {
      bVar22 = (pIVar8->OpenPopupStack).Size != 0;
    }
    (pIVar8->IO).WantCaptureMouse = bVar22;
  }
  else {
    (pIVar8->IO).WantCaptureMouse = pIVar8->WantCaptureMouseNextFrame != 0;
  }
  if (pIVar8->WantCaptureKeyboardNextFrame == -1) {
    bVar22 = pIVar8->ActiveId != 0 || pIVar9 != (ImGuiWindow *)0x0;
  }
  else {
    bVar22 = pIVar8->WantCaptureKeyboardNextFrame != 0;
  }
  (pIVar8->IO).WantCaptureKeyboard = bVar22;
  if (((uVar6 & 9) == 1) && ((pIVar8->IO).NavActive != false)) {
    (pIVar8->IO).WantCaptureKeyboard = true;
  }
  (pIVar8->IO).WantTextInput = pIVar8->WantTextInputNextFrame - 1U < 0xfffffffe;
  return;
}

Assistant:

void ImGui::UpdateHoveredWindowAndCaptureFlags()
{
    ImGuiContext& g = *GImGui;

    // Find the window hovered by mouse:
    // - Child windows can extend beyond the limit of their parent so we need to derive HoveredRootWindow from HoveredWindow.
    // - When moving a window we can skip the search, which also conveniently bypasses the fact that window->WindowRectClipped is lagging as this point of the frame.
    // - We also support the moved window toggling the NoInputs flag after moving has started in order to be able to detect windows below it, which is useful for e.g. docking mechanisms.
    FindHoveredWindow();
    IM_ASSERT(g.HoveredWindow == NULL || g.HoveredWindow == g.MovingWindow || g.HoveredWindow->Viewport == g.MouseViewport);

    // Modal windows prevents cursor from hovering behind them.
    ImGuiWindow* modal_window = GetTopMostPopupModal();
    if (modal_window)
        if (g.HoveredRootWindow && !IsWindowChildOf(g.HoveredRootWindow, modal_window))
            g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Disabled mouse?
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NoMouse)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // We track click ownership. When clicked outside of a window the click is owned by the application and won't report hovering nor request capture even while dragging over our windows afterward.
    int mouse_earliest_button_down = -1;
    bool mouse_any_down = false;
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.MouseDown); i++)
    {
        if (g.IO.MouseClicked[i])
            g.IO.MouseDownOwned[i] = (g.HoveredWindow != NULL) || (!g.OpenPopupStack.empty());
        mouse_any_down |= g.IO.MouseDown[i];
        if (g.IO.MouseDown[i])
            if (mouse_earliest_button_down == -1 || g.IO.MouseClickedTime[i] < g.IO.MouseClickedTime[mouse_earliest_button_down])
                mouse_earliest_button_down = i;
    }
    const bool mouse_avail_to_imgui = (mouse_earliest_button_down == -1) || g.IO.MouseDownOwned[mouse_earliest_button_down];

    // If mouse was first clicked outside of ImGui bounds we also cancel out hovering.
    // FIXME: For patterns of drag and drop across OS windows, we may need to rework/remove this test (first committed 311c0ca9 on 2015/02)
    const bool mouse_dragging_extern_payload = g.DragDropActive && (g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) != 0;
    if (!mouse_avail_to_imgui && !mouse_dragging_extern_payload)
        g.HoveredWindow = g.HoveredRootWindow = g.HoveredWindowUnderMovingWindow = NULL;

    // Update io.WantCaptureMouse for the user application (true = dispatch mouse info to imgui, false = dispatch mouse info to Dear ImGui + app)
    if (g.WantCaptureMouseNextFrame != -1)
        g.IO.WantCaptureMouse = (g.WantCaptureMouseNextFrame != 0);
    else
        g.IO.WantCaptureMouse = (mouse_avail_to_imgui && (g.HoveredWindow != NULL || mouse_any_down)) || (!g.OpenPopupStack.empty());

    // Update io.WantCaptureKeyboard for the user application (true = dispatch keyboard info to imgui, false = dispatch keyboard info to Dear ImGui + app)
    if (g.WantCaptureKeyboardNextFrame != -1)
        g.IO.WantCaptureKeyboard = (g.WantCaptureKeyboardNextFrame != 0);
    else
        g.IO.WantCaptureKeyboard = (g.ActiveId != 0) || (modal_window != NULL);
    if (g.IO.NavActive && (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavNoCaptureKeyboard))
        g.IO.WantCaptureKeyboard = true;

    // Update io.WantTextInput flag, this is to allow systems without a keyboard (e.g. mobile, hand-held) to show a software keyboard if possible
    g.IO.WantTextInput = (g.WantTextInputNextFrame != -1) ? (g.WantTextInputNextFrame != 0) : false;
}